

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.cpp
# Opt level: O2

uint __thiscall vm_val_t::calc_hash(vm_val_t *this,int depth)

{
  uint uVar1;
  uint uVar2;
  
  switch(this->typ) {
  case VM_NIL:
    return 0;
  case VM_TRUE:
    uVar1 = 1;
    break;
  default:
    uVar1 = 3;
    break;
  case VM_OBJ:
    uVar2 = (this->val).obj & 0xfff;
    uVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[(this->val).obj >> 0xc][uVar2].ptr_ + 0x108)
            )(G_obj_table_X.pages_[(this->val).obj >> 0xc] + uVar2);
    return uVar1;
  case VM_PROP:
    return (uint)(this->val).prop;
  case VM_INT:
  case VM_BIFPTR:
  case VM_BIFPTRX:
    return (uint)(ushort)((this->val).bifptr.func_idx * (this->val).prop);
  case VM_SSTRING:
    uVar1 = CVmObjString::const_calc_hash
                      (G_const_pool_X.super_CVmPoolPaged.pages_
                       [(this->val).obj >>
                        ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem +
                       (G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & (this->val).obj));
    return uVar1;
  case VM_LIST:
    uVar1 = CVmObjList::const_calc_hash
                      (this,G_const_pool_X.super_CVmPoolPaged.pages_
                            [(this->val).obj >>
                             ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem +
                            (G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & (this->val).obj),depth);
    return uVar1;
  case VM_CODEOFS:
  case VM_FUNCPTR:
  case VM_ENUM:
  case VM_OBJX:
    return (this->val).obj >> 0x10 ^ (this->val).obj & 0xffff;
  case VM_EMPTY:
    uVar1 = 2;
  }
  return uVar1;
}

Assistant:

uint vm_val_t::calc_hash(VMG_ int depth) const
{
    /* see what we have */
    switch(typ)
    {
    case VM_NIL:
        /* this is rather arbitrary */
        return 0;
        
    case VM_TRUE:
        /* this is arbitrary, but at least make it different from nil */
        return 1;
        
    case VM_EMPTY:
        /* also arbitrary */
        return 2;
        
    case VM_CODEOFS:
    case VM_FUNCPTR:
        /* use a 16-bit hash of the code address */
        return (uint)((val.ofs & 0xffff)
                      ^ ((val.ofs & 0xffff0000) >> 16));

    case VM_OBJX:
        /* use a 16-bit hash of the object ID */
        return (uint)((val.obj & 0xffff)
                      ^ ((val.obj & 0xffff0000) >> 16));

    case VM_PROP:
        /* use the property ID as the hash */
        return (uint)val.prop;

    case VM_INT:
    case VM_BIFPTR:
    case VM_BIFPTRX:
        /* 
         *   the set index and function index both tend to be small integers;
         *   multiply them and keep the low-order 16 bits 
         */
        return (uint)(val.bifptr.set_idx * val.bifptr.func_idx) & 0xffff;

    case VM_ENUM:
        /* use a 16-bit hash of the enum value */
        return (uint)((val.enumval & 0xffff)
                      ^ ((val.enumval & 0xffff0000) >> 16));

    case VM_OBJ:
        /* ask the object to calculate its hash value */
        return vm_objp(vmg_ val.obj)->calc_hash(vmg_ val.obj, depth);
        break;

    case VM_SSTRING:
        /* get the hash of the constant string */
        return CVmObjString::
            const_calc_hash(G_const_pool->get_ptr(val.ofs));
        break;

    case VM_LIST:
        /* get the hash of the constant list */
        return CVmObjList::
            const_calc_hash(vmg_ this, G_const_pool->get_ptr(val.ofs), depth);

    default:
        /* return an arbitrary value for any other type */
        return 3;
    }
}